

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFDie::getAddressRanges
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFDie *this)

{
  undefined1 *this_00;
  DWARFUnit *pDVar1;
  initializer_list<llvm::DWARFAddressRange> __l;
  bool bVar2;
  Form FVar3;
  DWARFFormValue *pDVar4;
  unsigned_long *puVar5;
  Optional<unsigned_long> OVar6;
  vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> local_118;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_100;
  undefined1 local_f8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_f0;
  undefined1 local_e8;
  undefined1 local_e0 [8];
  Optional<llvm::DWARFFormValue> Value;
  DWARFAddressRange local_a0;
  DWARFAddressRange *local_88;
  size_type local_80;
  vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> local_78;
  uint64_t local_60;
  uint64_t Index;
  uint64_t HighPC;
  uint64_t LowPC;
  vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> local_38;
  DWARFDie *local_18;
  DWARFDie *this_local;
  
  local_18 = this;
  this_local = (DWARFDie *)__return_storage_ptr__;
  bVar2 = isNULL(this);
  if (bVar2) {
    local_38.super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
              (&local_38);
    Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>::
    Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
              ((Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                *)__return_storage_ptr__,&local_38,(type *)0x0);
    std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::~vector
              (&local_38);
  }
  else {
    bVar2 = getLowAndHighPC(this,&HighPC,&Index,&local_60);
    if (bVar2) {
      DWARFAddressRange::DWARFAddressRange(&local_a0,HighPC,Index,local_60);
      local_80 = 1;
      this_00 = &Value.Storage.field_0x37;
      local_88 = &local_a0;
      std::allocator<llvm::DWARFAddressRange>::allocator
                ((allocator<llvm::DWARFAddressRange> *)this_00);
      __l._M_len = local_80;
      __l._M_array = local_88;
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
                (&local_78,__l,(allocator_type *)this_00);
      Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>::
      Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                ((Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                  *)__return_storage_ptr__,&local_78,(type *)0x0);
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::~vector
                (&local_78);
      std::allocator<llvm::DWARFAddressRange>::~allocator
                ((allocator<llvm::DWARFAddressRange> *)&Value.Storage.field_0x37);
    }
    else {
      find((Optional<llvm::DWARFFormValue> *)local_e0,this,DW_AT_ranges);
      bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)local_e0);
      if (bVar2) {
        pDVar4 = Optional<llvm::DWARFFormValue>::operator->
                           ((Optional<llvm::DWARFFormValue> *)local_e0);
        FVar3 = DWARFFormValue::getForm(pDVar4);
        if (FVar3 == DW_FORM_rnglistx) {
          pDVar1 = this->U;
          pDVar4 = Optional<llvm::DWARFFormValue>::operator->
                             ((Optional<llvm::DWARFFormValue> *)local_e0);
          OVar6 = DWARFFormValue::getAsSectionOffset(pDVar4);
          local_f0 = OVar6.Storage.field_0;
          local_e8 = OVar6.Storage.hasVal;
          puVar5 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_f0);
          DWARFUnit::findRnglistFromIndex(__return_storage_ptr__,pDVar1,(uint32_t)*puVar5);
        }
        else {
          pDVar1 = this->U;
          pDVar4 = Optional<llvm::DWARFFormValue>::operator->
                             ((Optional<llvm::DWARFFormValue> *)local_e0);
          OVar6 = DWARFFormValue::getAsSectionOffset(pDVar4);
          local_100 = OVar6.Storage.field_0;
          local_f8 = OVar6.Storage.hasVal;
          puVar5 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_100);
          DWARFUnit::findRnglistFromOffset(__return_storage_ptr__,pDVar1,*puVar5);
        }
      }
      else {
        local_118.
        super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118.
        super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
                  (&local_118);
        Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>::
        Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                  ((Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                    *)__return_storage_ptr__,&local_118,(type *)0x0);
        std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::~vector
                  (&local_118);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector> DWARFDie::getAddressRanges() const {
  if (isNULL())
    return DWARFAddressRangesVector();
  // Single range specified by low/high PC.
  uint64_t LowPC, HighPC, Index;
  if (getLowAndHighPC(LowPC, HighPC, Index))
    return DWARFAddressRangesVector{{LowPC, HighPC, Index}};

  Optional<DWARFFormValue> Value = find(DW_AT_ranges);
  if (Value) {
    if (Value->getForm() == DW_FORM_rnglistx)
      return U->findRnglistFromIndex(*Value->getAsSectionOffset());
    return U->findRnglistFromOffset(*Value->getAsSectionOffset());
  }
  return DWARFAddressRangesVector();
}